

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

void nhdp_domain_store_willingness(nhdp_link *lnk)

{
  byte bVar1;
  list_entity **pplVar2;
  ulong uVar3;
  list_entity *plVar4;
  
  uVar3 = (ulong)_flooding_domain._tmp_willingness;
  lnk->flooding_willingness = _flooding_domain._tmp_willingness;
  if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2ea,(void *)0x0,0,
             "Set flooding willingness: %u",uVar3);
  }
  plVar4 = _domain_list.next;
  if ((_domain_list.next)->prev != _domain_list.prev) {
    do {
      bVar1 = *(byte *)((long)&plVar4[-0x27].prev + 1);
      lnk->neigh->_domaindata[*(int *)((long)&plVar4[-0x27].next + 4)].willingness = bVar1;
      if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
        oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2ef,(void *)0x0,0,
                 "Set routing willingness for domain %u: %u",
                 (ulong)*(byte *)((long)&plVar4[-0x27].next + 1),(ulong)bVar1);
      }
      pplVar2 = &plVar4->next;
      plVar4 = *pplVar2;
    } while ((*pplVar2)->prev != _domain_list.prev);
  }
  return;
}

Assistant:

void
nhdp_domain_store_willingness(struct nhdp_link *lnk) {
  struct nhdp_neighbor_domaindata *neighdata;
  struct nhdp_domain *domain;

  lnk->flooding_willingness = _flooding_domain._tmp_willingness;
  OONF_DEBUG(LOG_NHDP_R, "Set flooding willingness: %u", lnk->flooding_willingness);

  list_for_each_element(&_domain_list, domain, _node) {
    neighdata = nhdp_domain_get_neighbordata(domain, lnk->neigh);
    neighdata->willingness = domain->_tmp_willingness;
    OONF_DEBUG(LOG_NHDP_R, "Set routing willingness for domain %u: %u", domain->ext, neighdata->willingness);
  }
}